

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seismogram.cpp
# Opt level: O2

void __thiscall
CombinedSeismogramm<float,_2>::Load
          (CombinedSeismogramm<float,_2> *this,SeismoType type,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *paths)

{
  vector<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_> *this_00;
  int iVar1;
  pointer pbVar2;
  float *pfVar3;
  pointer pSVar4;
  double dVar5;
  uint uVar6;
  bool bVar7;
  uint uVar8;
  reference pvVar9;
  ostream *poVar10;
  reference pvVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  undefined2 uVar18;
  int k_1;
  long lVar19;
  undefined2 uVar20;
  int k;
  uint uVar21;
  long lVar22;
  float fVar23;
  float fVar24;
  uint local_b34;
  float local_b28;
  float local_b24;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  line;
  vector<float,_std::allocator<float>_> rec_y;
  vector<float,_std::allocator<float>_> rec_x;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v_1;
  string filename_source;
  string filename;
  string filename_rec;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_9f8;
  undefined8 local_9e0;
  undefined4 local_9d8;
  undefined2 local_9d4;
  undefined2 local_9d2;
  undefined2 local_9d0;
  undefined2 local_9ce;
  undefined2 local_9cc;
  undefined2 local_9ca;
  undefined2 local_9c8;
  undefined2 auStack_9c6 [17];
  undefined2 auStack_9a4 [170];
  ifstream ifs_source;
  undefined4 uStack_84c;
  long local_848;
  byte abStack_830 [488];
  ifstream ifs_rec;
  byte abStack_628 [488];
  ifstream ifs;
  ifstream ifs0;
  byte abStack_218 [488];
  
  this_00 = &this->seismogramms;
  std::vector<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>::resize
            (this_00,((long)(this->componentInfos).
                            super__Vector_base<CombinedSeismogramm<float,_2>::ComponentInfo,_std::allocator<CombinedSeismogramm<float,_2>::ComponentInfo>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->componentInfos).
                           super__Vector_base<CombinedSeismogramm<float,_2>::ComponentInfo,_std::allocator<CombinedSeismogramm<float,_2>::ComponentInfo>_>
                           ._M_impl.super__Vector_impl_data._M_start) / 0x28);
  if (type == CSV) {
    std::vector<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>::resize
              (this_00,(long)(paths->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(paths->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start >> 4);
    uVar15 = 0;
    uVar8 = 0;
    while( true ) {
      uVar13 = (ulong)uVar8;
      pbVar2 = (paths->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(paths->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) <= uVar13)
      break;
      std::operator+(&filename,pbVar2 + uVar13,".csv");
      std::ifstream::ifstream((istream *)&ifs0);
      std::ifstream::open((char *)&ifs0,(_Ios_Openmode)filename._M_dataplus._M_p);
      if ((abStack_218[*(long *)(_ifs0 + -0x18)] & 5) != 0) {
        poVar10 = std::operator<<((ostream *)&std::cout,"Error in reading CSV file.");
        std::endl<char,std::char_traits<char>>(poVar10);
        poVar10 = std::operator<<((ostream *)&std::cout,"There is no such file: ");
        poVar10 = std::operator<<(poVar10,(string *)&filename);
        std::endl<char,std::char_traits<char>>(poVar10);
        exit(1);
      }
      getNextLineAndSplitIntoTokens_abi_cxx11_(&line,(istream *)&ifs0,';');
      uVar16 = (long)line.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)line.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5;
      uVar21 = (int)uVar16 - 1;
      local_b34 = uVar21 >> 1;
      bVar7 = std::operator==(line.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish + -1,"\r");
      uVar12 = (ulong)uVar21;
      if (!bVar7) {
        uVar12 = uVar16;
      }
      uVar21 = 0xfffffffe;
      while ((uVar12 & 0xffffffff) <=
             (ulong)((long)line.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)line.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5)) {
        getNextLineAndSplitIntoTokens_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&ifs,(istream *)&ifs0,';');
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_move_assign(&line,&ifs);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&ifs);
        uVar21 = uVar21 + 1;
      }
      std::ifstream::close();
      std::ifstream::ifstream((istream *)&ifs);
      std::ifstream::open((char *)&ifs,(_Ios_Openmode)filename._M_dataplus._M_p);
      getNextLineAndSplitIntoTokens_abi_cxx11_(&local_9f8,(istream *)&ifs,';');
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_9f8);
      getNextLineAndSplitIntoTokens_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&ifs_rec,(istream *)&ifs,';');
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_move_assign(&line,&ifs_rec);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&ifs_rec);
      uVar6 = uVar8 * 2;
      for (lVar22 = 0; lVar22 != 2; lVar22 = lVar22 + 1) {
        pvVar9 = std::vector<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>::at
                           (this_00,uVar15 + lVar22);
        std::
        vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ::resize(&pvVar9->data,
                 ((long)line.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)line.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5) - 1U >> 1);
      }
      uVar16 = (ulong)local_b34;
      for (uVar17 = 0; uVar17 != uVar16; uVar17 = uVar17 + 1) {
        for (lVar22 = 0; lVar22 != 2; lVar22 = lVar22 + 1) {
          pvVar9 = std::vector<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>::at
                             (this_00,uVar15 + lVar22);
          std::vector<float,_std::allocator<float>_>::resize
                    ((pvVar9->data).
                     super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar17,(ulong)(uVar21 + 1));
        }
      }
      std::vector<float,_std::allocator<float>_>::resize(&this->times,(ulong)(uVar21 + 1));
      uVar14 = 0;
      while ((uVar12 & 0xffffffff) <=
             (ulong)((long)line.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)line.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5)) {
        dVar5 = atof(((line.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
        uVar17 = (ulong)uVar14;
        (this->times).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start[uVar17] = (float)dVar5;
        lVar19 = 0;
        for (lVar22 = 0; uVar16 * 0x18 - lVar22 != 0; lVar22 = lVar22 + 0x18) {
          dVar5 = atof(*(char **)((long)&line.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus.
                                         _M_p + lVar19));
          pvVar9 = std::vector<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>::at
                             (this_00,(ulong)uVar6);
          *(float *)(*(long *)((long)&(((pvVar9->data).
                                        super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->
                                      super__Vector_base<float,_std::allocator<float>_>)._M_impl +
                              lVar22) + uVar17 * 4) = (float)dVar5;
          dVar5 = atof(*(char **)((long)&line.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus.
                                         _M_p + lVar19));
          pvVar9 = std::vector<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>::at
                             (this_00,(ulong)(uVar6 | 1));
          *(float *)(*(long *)((long)&(((pvVar9->data).
                                        super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->
                                      super__Vector_base<float,_std::allocator<float>_>)._M_impl +
                              lVar22) + uVar17 * 4) = (float)dVar5;
          lVar19 = lVar19 + 0x40;
        }
        getNextLineAndSplitIntoTokens_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&ifs_rec,(istream *)&ifs,';');
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_move_assign(&line,&ifs_rec);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&ifs_rec);
        uVar14 = uVar14 + 1;
      }
      pfVar3 = (this->times).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      interpolate_data_on_equal_time_intervals
                (this,((pfVar3[uVar21] - *pfVar3) / (float)uVar21) * this->interpolation_multiplier)
      ;
      iVar1 = *(int *)&(this->times).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish;
      pfVar3 = (this->times).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar5 = floor((double)(pfVar3[1] - *pfVar3) * 1000000.0 + 0.5);
      uVar18 = (undefined2)(long)dVar5;
      local_9e0 = 0x100000001;
      local_9d4 = (undefined2)local_b34;
      local_9d2 = 0;
      local_9c8 = 5;
      local_9d8 = 1;
      uVar20 = (undefined2)((uint)(iVar1 - (int)pfVar3) >> 2);
      for (lVar22 = 0xd; lVar22 != 0x1e; lVar22 = lVar22 + 1) {
        *(undefined2 *)((long)&local_9e0 + lVar22 * 2) = 0;
      }
      for (lVar22 = 0x1e; lVar22 != 200; lVar22 = lVar22 + 1) {
        *(undefined2 *)((long)&local_9e0 + lVar22 * 2) = 0;
      }
      local_9d0 = uVar18;
      local_9ce = uVar18;
      local_9cc = uVar20;
      local_9ca = uVar20;
      for (lVar22 = 0x18; lVar22 != 0x398; lVar22 = lVar22 + 0x1c0) {
        memcpy((void *)((long)(this_00->
                              super__Vector_base<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>
                              )._M_impl.super__Vector_impl_data._M_start[uVar15].header_data.other +
                       lVar22 + 0xffffffffffffffceU),&local_9e0,400);
      }
      std::operator+(&filename_rec,
                     (paths->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + uVar13,".receivers.csv");
      std::ifstream::ifstream((istream *)&ifs_rec);
      std::ifstream::open((char *)&ifs_rec,(_Ios_Openmode)filename_rec._M_dataplus._M_p);
      rec_x.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      rec_x.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      rec_x.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      rec_y.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      rec_y.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      rec_y.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      if ((abStack_628[*(long *)(_ifs_rec + -0x18)] & 5) == 0) {
        while( true ) {
          bVar7 = local_b34 == 0;
          local_b34 = local_b34 - 1;
          if (bVar7) break;
          getNextLineAndSplitIntoTokens_abi_cxx11_
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&ifs_source,(istream *)&ifs_rec,';');
          if ((ulong)(local_848 - CONCAT44(uStack_84c,_ifs_source)) < 0x21) {
            poVar10 = std::operator<<((ostream *)&std::cout,"Error while reading receivers data");
            std::endl<char,std::char_traits<char>>(poVar10);
          }
          else {
            pvVar11 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&ifs_source,0);
            dVar5 = atof((pvVar11->_M_dataplus)._M_p);
            filename_source._M_dataplus._M_p._0_4_ = (float)dVar5;
            std::vector<float,_std::allocator<float>_>::emplace_back<float>
                      (&rec_x,(float *)&filename_source);
            pvVar11 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&ifs_source,1);
            dVar5 = atof((pvVar11->_M_dataplus)._M_p);
            filename_source._M_dataplus._M_p._0_4_ = (float)dVar5;
            std::vector<float,_std::allocator<float>_>::emplace_back<float>
                      (&rec_y,(float *)&filename_source);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&ifs_source);
        }
      }
      else {
        poVar10 = std::operator<<((ostream *)&std::cout,"Warning: no csv receivers data found");
        std::endl<char,std::char_traits<char>>(poVar10);
        poVar10 = std::operator<<((ostream *)&std::cout,
                                  "         All receivers positions have been set to (0.0, 0.0)");
        std::endl<char,std::char_traits<char>>(poVar10);
        while( true ) {
          bVar7 = local_b34 == 0;
          local_b34 = local_b34 - 1;
          if (bVar7) break;
          _ifs_source = 0;
          std::vector<float,_std::allocator<float>_>::emplace_back<float>
                    (&rec_x,(float *)&ifs_source);
          _ifs_source = 0;
          std::vector<float,_std::allocator<float>_>::emplace_back<float>
                    (&rec_y,(float *)&ifs_source);
        }
      }
      std::operator+(&filename_source,
                     (paths->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + uVar13,".source.csv");
      std::ifstream::ifstream((istream *)&ifs_source);
      std::ifstream::open((char *)&ifs_source,(_Ios_Openmode)filename_source._M_dataplus._M_p._0_4_)
      ;
      if ((abStack_830[*(long *)(CONCAT44(uStack_84c,_ifs_source) + -0x18)] & 5) == 0) {
        getNextLineAndSplitIntoTokens_abi_cxx11_(&v_1,(istream *)&ifs_source,';');
        if ((ulong)((long)v_1.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)v_1.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
          poVar10 = std::operator<<((ostream *)&std::cout,"Error while reading source data");
          std::endl<char,std::char_traits<char>>(poVar10);
        }
        else {
          pvVar11 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::at(&v_1,0);
          dVar5 = atof((pvVar11->_M_dataplus)._M_p);
          pvVar11 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::at(&v_1,1);
          local_b28 = (float)dVar5;
          dVar5 = atof((pvVar11->_M_dataplus)._M_p);
          local_b24 = (float)dVar5;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&v_1);
      }
      else {
        poVar10 = std::operator<<((ostream *)&std::cout,"Warning: no csv source data found");
        std::endl<char,std::char_traits<char>>(poVar10);
        poVar10 = std::operator<<((ostream *)&std::cout,
                                  "         Source position has been set to (0.0, 0.0)");
        std::endl<char,std::char_traits<char>>(poVar10);
        local_b28 = 0.0;
        local_b24 = 0.0;
      }
      for (uVar13 = 0; uVar13 != 2; uVar13 = uVar13 + 1) {
        uVar12 = uVar13 | uVar6;
        std::vector<segy_trace_header,_std::allocator<segy_trace_header>_>::resize
                  (&(this_00->
                    super__Vector_base<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>).
                    _M_impl.super__Vector_impl_data._M_start[uVar12].trace_header_data,uVar16);
        pSVar4 = (this_00->
                 super__Vector_base<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        lVar22 = 0;
        for (uVar17 = 0; uVar16 != uVar17; uVar17 = uVar17 + 1) {
          lVar19 = *(long *)&pSVar4[uVar12].trace_header_data.
                             super__Vector_base<segy_trace_header,_std::allocator<segy_trace_header>_>
                             ._M_impl.super__Vector_impl_data;
          *(int *)(lVar19 + lVar22) = (int)uVar17;
          *(int *)(lVar19 + 4 + lVar22) = (int)uVar17;
          *(short *)(lVar19 + 0x1c + lVar22) = (short)uVar17;
          fVar23 = rec_x.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar17];
          *(int *)(lVar19 + 0x50 + lVar22) = (int)(long)fVar23;
          fVar24 = rec_y.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar17];
          *(int *)(lVar19 + 0x54 + lVar22) = (int)(long)fVar24;
          *(int *)(lVar19 + 0x48 + lVar22) = (int)(long)local_b28;
          *(int *)(lVar19 + 0x4c + lVar22) = (int)(long)local_b24;
          *(undefined8 *)(lVar19 + 8 + lVar22) = 0x100000001;
          *(undefined2 *)(lVar19 + 0x72 + lVar22) = uVar20;
          *(undefined2 *)(lVar19 + 0x74 + lVar22) = uVar18;
          fVar23 = fVar23 - local_b28;
          fVar24 = fVar24 - local_b24;
          *(undefined2 *)(lVar19 + 0x58 + lVar22) = 1;
          *(int *)(lVar19 + 0x24 + lVar22) =
               (int)(long)SQRT(fVar23 * fVar23 + fVar24 * fVar24 + 0.5);
          lVar22 = lVar22 + 0xf0;
        }
      }
      std::ifstream::~ifstream(&ifs_source);
      std::__cxx11::string::~string((string *)&filename_source);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&rec_y.super__Vector_base<float,_std::allocator<float>_>);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&rec_x.super__Vector_base<float,_std::allocator<float>_>);
      std::ifstream::~ifstream(&ifs_rec);
      std::__cxx11::string::~string((string *)&filename_rec);
      std::ifstream::~ifstream(&ifs);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&line);
      std::ifstream::~ifstream(&ifs0);
      std::__cxx11::string::~string((string *)&filename);
      uVar8 = uVar8 + 1;
      uVar15 = (ulong)((int)uVar15 + 2);
    }
  }
  else if (type == SEG_Y) {
    uVar8 = 0;
    while( true ) {
      uVar15 = (ulong)uVar8;
      pbVar2 = (paths->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(paths->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) <= uVar15)
      break;
      Seismogramm<float>::LoadSegY
                ((this->seismogramms).
                 super__Vector_base<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>.
                 _M_impl.super__Vector_impl_data._M_start + uVar15,pbVar2 + uVar15,&this->times);
      uVar8 = uVar8 + 1;
    }
  }
  return;
}

Assistant:

void CombinedSeismogramm<Scalar, dims>::Load(SeismoType type, std::vector<std::string> paths)
{
    seismogramms.resize(componentInfos.size());
    if (type == SEG_Y)
    {
        for (IndexType p = 0; p < paths.size(); ++p)
        {
            seismogramms[p].LoadSegY(paths[p], times);
        }
    }
    else if (type == CSV)
    {
        seismogramms.resize(paths.size() * dims);
        for (IndexType path_index = 0; path_index < paths.size(); path_index++)
        {
            // Calculating number of time steps and number of traces
            // ///////////////////////////////////////
            std::string filename = paths[path_index] + ".csv";
            IndexType num_of_times = -1;
            IndexType num_of_all_traces = 0;
            IndexType num_of_receivers;
            std::ifstream ifs0;
            ifs0.open(filename.c_str());
            if (!ifs0)
            {
                std::cout << "Error in reading CSV file." << std::endl;
                std::cout << "There is no such file: " << filename << std::endl;
                std::exit(1);
            }
            std::vector<std::string> line = getNextLineAndSplitIntoTokens(ifs0);
            num_of_all_traces = line.size() - 1;
            num_of_receivers = num_of_all_traces / dims;
            if (line.back() == "\r") num_of_all_traces -= 1;
            while (line.size() >= num_of_all_traces + 1)
            {
                line = getNextLineAndSplitIntoTokens(ifs0);
                num_of_times++;
            }
            ifs0.close();

            // Reading  data
            // ///////////////////////////////////////
            std::ifstream ifs;
            ifs.open(filename.c_str());
            getNextLineAndSplitIntoTokens(ifs);

            line = getNextLineAndSplitIntoTokens(ifs);

            for (int k = 0; k < dims; k++)
                seismogramms.at(dims * path_index + k).data.resize((line.size()-1)/dims);

            for (int trace_i = 0; trace_i < num_of_receivers; trace_i++)
            {
                for (int k = 0; k < dims; k++)
                    seismogramms.at(dims * path_index + k).data[trace_i].resize(num_of_times);
            }
            times.resize(num_of_times);

            IndexType time_i = 0;
            while (line.size() >= num_of_all_traces + 1)
            {
                times[time_i] = ::atof(line[0].c_str());
                for (int trace_i = 0; trace_i < num_of_receivers; trace_i++)
                {
                    seismogramms.at(dims * path_index + 0).data[trace_i][time_i] = ::atof(line[1 + trace_i * dims].c_str());
                    seismogramms.at(dims * path_index + 1).data[trace_i][time_i] = ::atof(line[2 + trace_i * dims].c_str());
                    if (dims >= 3)
                        seismogramms.at(dims * path_index + 2).data[trace_i][time_i] = ::atof(line[3 + trace_i * dims].c_str());
                }
                line = getNextLineAndSplitIntoTokens(ifs);
                time_i++;
            }

            // Interpolating results on eqidistant time grid
            // ///////////////////////////////////////

            Scalar interval = (times[num_of_times-1] - times[0]) / (num_of_times - 1);
            interpolate_data_on_equal_time_intervals(interval * interpolation_multiplier);
            num_of_times = times.size();
            interval = times[1] - times[0];


            // Set binary header data
            // ///////////////////////////////////////
            struct segy_bin_header_data header_data;
            header_data.sample_interval = (uint32)(floor(interval * 1000000.0 + 0.5));
            header_data.sample_interval_reel = header_data.sample_interval;


            header_data.job_id = 1;
            header_data.line_num = 1;
            header_data.reel_num = 1;
            header_data.num_of_traces_per_record = num_of_receivers;
            header_data.num_of_auxiliary_traces_per_record = 0;
            header_data.data_sample_format = 5;
            header_data.reel_num = 1;
            header_data.samples_per_trace = num_of_times;
            header_data.samples_per_trace_reel = header_data.samples_per_trace;
            for (int i = 0; i < 17; i++)
                header_data.other[i] = 0;
            for (int i = 0; i < 170; i++)
                header_data.reserve[i] = 0;

            for (IndexType k = 0; k < dims; k++)
            {
                seismogramms[dims*path_index + k].header_data = header_data;
            }



            // Set trace header data
            // ///////////////////////////////////////

            // Reading receivers data
            std::string filename_rec = paths[path_index] + ".receivers.csv";
            std::ifstream ifs_rec;
            ifs_rec.open(filename_rec.c_str());
            std::vector<Scalar> rec_x;
            std::vector<Scalar> rec_y;
            if (ifs_rec)
            {
                for (IndexType i = 0; i < num_of_receivers; i++)
                {
                    std::vector<std::string> v = getNextLineAndSplitIntoTokens(ifs_rec);
                    if (v.size() < 2)
                    {
                        std::cout << "Error while reading receivers data" << std::endl;
                    }
                    else
                    {
                        rec_x.push_back(::atof(v.at(0).c_str()));
                        rec_y.push_back(::atof(v.at(1).c_str()));
                    }
                }
            }
            else
            {
                std::cout << "Warning: no csv receivers data found" << std::endl;
                std::cout << "         All receivers positions have been set to (0.0, 0.0)" << std::endl;
                for (IndexType i = 0; i < num_of_receivers; i++)
                {
                    rec_x.push_back(0.0);
                    rec_y.push_back(0.0);
                }
            }

            // Reading source data
            std::string filename_source = paths[path_index] + ".source.csv";
            std::ifstream ifs_source;
            ifs_source.open(filename_source.c_str());
            Scalar source_x;
            Scalar source_y;
            if (ifs_source)
            {
                std::vector<std::string> v = getNextLineAndSplitIntoTokens(ifs_source);
                if (v.size() < 2)
                {
                    std::cout << "Error while reading source data" << std::endl;
                }
                else
                {
                    source_x = ::atof(v.at(0).c_str());
                    source_y = ::atof(v.at(1).c_str());
                }
            }
            else
            {
                std::cout << "Warning: no csv source data found" << std::endl;
                std::cout << "         Source position has been set to (0.0, 0.0)" << std::endl;
                source_x = 0.0;
                source_y = 0.0;
            }

            // Setting trace headers data

            for (IndexType k = 0; k < dims; k++)
            {
                seismogramms[dims*path_index + k].trace_header_data.resize(num_of_receivers);
                for (int i = 0; i < num_of_receivers; i++)
                {
                    seismogramms[dims*path_index + k].trace_header_data[i].trace_seq_num_line = i;
                    seismogramms[dims*path_index + k].trace_header_data[i].trace_seq_num_reel = i;
                    seismogramms[dims*path_index + k].trace_header_data[i].trace_id_code = i;
                    seismogramms[dims*path_index + k].trace_header_data[i].receiver_x = rec_x[i];
                    seismogramms[dims*path_index + k].trace_header_data[i].receiver_y = rec_y[i];
                    seismogramms[dims*path_index + k].trace_header_data[i].source_x = source_x;
                    seismogramms[dims*path_index + k].trace_header_data[i].source_y = source_y;
                    seismogramms[dims*path_index + k].trace_header_data[i].field_record_num = 1;
                    seismogramms[dims*path_index + k].trace_header_data[i].num_of_samples = header_data.samples_per_trace;
                    seismogramms[dims*path_index + k].trace_header_data[i].sample_interval = header_data.sample_interval;
                    seismogramms[dims*path_index + k].trace_header_data[i].trace_num_reel = 1;
                    seismogramms[dims*path_index + k].trace_header_data[i].units_id = 1;
                    seismogramms[dims*path_index + k].trace_header_data[i].distance_from_source =
                            uint32(sqrt(Scalar((rec_x[i]-source_x)*(rec_x[i]-source_x) + (rec_y[i]-source_y)*(rec_y[i]-source_y)) + 0.5));
                }
            }


        }
    }
}